

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleanimation.cpp
# Opt level: O2

bool __thiscall QNumberStyleAnimation::isUpdateNeeded(QNumberStyleAnimation *this)

{
  bool bVar1;
  qreal p2;
  
  bVar1 = QStyleAnimation::isUpdateNeeded((QStyleAnimation *)this);
  if (bVar1) {
    p2 = currentValue(this);
    bVar1 = qFuzzyCompare(*(double *)(this + 0x38),p2);
    if (!bVar1) {
      *(qreal *)(this + 0x38) = p2;
      return true;
    }
  }
  return false;
}

Assistant:

bool QNumberStyleAnimation::isUpdateNeeded() const
{
    if (QStyleAnimation::isUpdateNeeded()) {
        qreal current = currentValue();
        if (!qFuzzyCompare(_prev, current))
        {
            _prev = current;
            return true;
        }
    }
    return false;
}